

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::log_internal::Encode64Bit
          (log_internal *this,uint64_t tag,uint64_t value,Span<char> *buf)

{
  ulong uVar1;
  anon_unknown_4 *paVar2;
  ulong uVar3;
  anon_unknown_4 *paVar4;
  size_t sVar5;
  ulong uVar6;
  void *__src;
  ulong uVar7;
  size_t sVar8;
  anon_unknown_4 *paVar9;
  size_type *psVar10;
  undefined1 *puVar11;
  Span<char> *pSVar12;
  Span<char> *buf_00;
  ulong *size;
  anon_unknown_4 *this_00;
  anon_unknown_4 *extraout_RDX;
  undefined8 *size_00;
  void *value_00;
  anon_unknown_4 *paVar13;
  pointer __dest;
  anon_unknown_4 *paVar14;
  undefined1 uVar15;
  anon_unknown_4 *this_01;
  
  paVar13 = (anon_unknown_4 *)((long)this * 8 + 1);
  sVar5 = VarintSize((uint64_t)paVar13);
  uVar1 = sVar5 + 8;
  uVar3 = *(ulong *)(value + 8);
  if (uVar3 < uVar1) {
    psVar10 = (size_type *)0x0;
  }
  else {
    anon_unknown_4::EncodeRawVarint(paVar13,sVar5,value,buf);
    uVar6 = 0;
    do {
      if (*(ulong *)(value + 8) <= uVar6) {
        Encode64Bit();
        goto LAB_004c781d;
      }
      buf = *(Span<char> **)value;
      *(char *)((long)&buf->ptr_ + uVar6) = (char)tag;
      tag = tag >> 8;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 8);
    buf = *(Span<char> **)(value + 8);
    if (buf < (Span<char> *)&DAT_00000008) {
LAB_004c781d:
      Encode64Bit();
      uVar6 = sVar5 & 0xffffffff;
      paVar13 = (anon_unknown_4 *)((long)paVar13 * 8 + 5);
      __src = (void *)VarintSize((uint64_t)paVar13);
      uVar1 = (long)__src + 4;
      uVar3 = size[1];
      if (uVar3 < uVar1) {
        puVar11 = (undefined1 *)0x0;
      }
      else {
        anon_unknown_4::EncodeRawVarint(paVar13,(uint64_t)__src,(size_t)size,buf);
        uVar7 = 0;
        do {
          if (size[1] <= uVar7) {
            Encode32Bit();
            goto LAB_004c78a3;
          }
          buf = (Span<char> *)*size;
          *(char *)((long)&buf->ptr_ + uVar7) = (char)uVar6;
          uVar6 = uVar6 >> 8;
          uVar7 = uVar7 + 1;
        } while (uVar7 != 4);
        buf = (Span<char> *)size[1];
        if (buf < (Span<char> *)0x4) {
LAB_004c78a3:
          Encode32Bit();
          paVar13 = (anon_unknown_4 *)((long)paVar13 * 8 + 2);
          pSVar12 = buf;
          sVar5 = VarintSize((uint64_t)paVar13);
          sVar8 = VarintSize((uint64_t)this_00);
          paVar14 = (anon_unknown_4 *)buf->len_;
          if (paVar14 < this_00 + sVar5 + sVar8) {
            pSVar12 = (Span<char> *)0x0;
          }
          else {
            anon_unknown_4::EncodeRawVarint(paVar13,sVar5,(size_t)buf,pSVar12);
            anon_unknown_4::EncodeRawVarint(this_00,sVar8,(size_t)buf,pSVar12);
            __dest = buf->ptr_;
            memcpy(__dest,__src,(size_t)this_00);
            pSVar12 = (Span<char> *)((anon_unknown_4 *)buf->len_ + -(long)this_00);
            if ((anon_unknown_4 *)buf->len_ < this_00) {
              EncodeBytes();
              paVar13 = (anon_unknown_4 *)((long)__dest * 8 + 2);
              buf_00 = pSVar12;
              value_00 = __src;
              sVar5 = VarintSize((uint64_t)paVar13);
              paVar14 = (anon_unknown_4 *)pSVar12->len_;
              if (extraout_RDX <= paVar14) {
                paVar14 = extraout_RDX;
              }
              sVar8 = VarintSize((uint64_t)paVar14);
              paVar2 = (anon_unknown_4 *)(sVar8 + sVar5);
              paVar4 = (anon_unknown_4 *)pSVar12->len_;
              this_01 = extraout_RDX;
              if (((paVar2 <= paVar4) &&
                  (paVar9 = paVar2 + (long)extraout_RDX + -(long)paVar4,
                  paVar4 <= paVar2 + (long)extraout_RDX && paVar9 != (anon_unknown_4 *)0x0)) &&
                 (this_01 = extraout_RDX + -(long)paVar9, extraout_RDX < paVar9)) {
LAB_004c7a13:
                EncodeBytesTruncate();
                paVar13 = (anon_unknown_4 *)((long)paVar14 * 8 + 2);
                sVar5 = VarintSize((uint64_t)paVar13);
                if ((void *)size_00[1] < value_00) {
                  value_00 = (void *)size_00[1];
                }
                sVar8 = VarintSize((uint64_t)value_00);
                if ((ulong)size_00[1] < sVar8 + sVar5) {
                  size_00[1] = 0;
                  uVar15 = 0;
                }
                else {
                  anon_unknown_4::EncodeRawVarint(paVar13,sVar5,(size_t)size_00,buf_00);
                  uVar15 = (undefined1)*size_00;
                  anon_unknown_4::EncodeRawVarint
                            ((anon_unknown_4 *)0x0,sVar8,(size_t)size_00,buf_00);
                }
                return (bool)uVar15;
              }
              if (paVar4 < paVar2 + (long)this_01) {
                buf_00 = (Span<char> *)0x0;
              }
              else {
                anon_unknown_4::EncodeRawVarint(paVar13,sVar5,(size_t)pSVar12,buf_00);
                anon_unknown_4::EncodeRawVarint(this_01,sVar8,(size_t)pSVar12,buf_00);
                paVar14 = (anon_unknown_4 *)pSVar12->ptr_;
                memcpy(paVar14,__src,(size_t)this_01);
                buf_00 = (Span<char> *)((anon_unknown_4 *)pSVar12->len_ + -(long)this_01);
                if ((anon_unknown_4 *)pSVar12->len_ < this_01) {
                  EncodeBytesTruncate();
                  value_00 = __src;
                  goto LAB_004c7a13;
                }
                pSVar12->ptr_ = (pointer)(this_01 + (long)pSVar12->ptr_);
              }
              pSVar12->len_ = (size_type)buf_00;
              return paVar2 + (long)this_01 <= paVar4;
            }
            buf->ptr_ = (pointer)(this_00 + (long)buf->ptr_);
          }
          buf->len_ = (size_type)pSVar12;
          return this_00 + sVar5 + sVar8 <= paVar14;
        }
        *size = *size + 4;
        puVar11 = (undefined1 *)((long)&buf[-1].len_ + 4);
      }
      size[1] = (ulong)puVar11;
      return uVar1 <= uVar3;
    }
    *(long *)value = *(long *)value + 8;
    psVar10 = &buf[-1].len_;
  }
  *(size_type **)(value + 8) = psVar10;
  return uVar1 <= uVar3;
}

Assistant:

bool Encode64Bit(uint64_t tag, uint64_t value, absl::Span<char> *buf) {
  const uint64_t tag_type = MakeTagType(tag, WireType::k64Bit);
  const size_t tag_type_size = VarintSize(tag_type);
  if (tag_type_size + sizeof(value) > buf->size()) {
    buf->remove_suffix(buf->size());
    return false;
  }
  EncodeRawVarint(tag_type, tag_type_size, buf);
  for (size_t s = 0; s < sizeof(value); s++) {
    (*buf)[s] = static_cast<char>(value & 0xff);
    value >>= 8;
  }
  buf->remove_prefix(sizeof(value));
  return true;
}